

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O0

XPMPPlaneID
XPMPCreatePlaneWithModelName
          (char *inModelName,char *inICAOCode,char *inAirline,char *inLivery,
          XPMPPlaneData_f inDataFunc,void *inRefcon,XPMPPlaneID inModeS_id)

{
  XPMPPlaneID XVar1;
  Aircraft *this;
  XPMPPlaneData_f in_RDI;
  undefined4 in_stack_00000008;
  XPMP2Error *e;
  LegacyAircraft *pAc;
  undefined4 in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  LegacyAircraft *in_stack_ffffffffffffff50;
  XPMPPlaneID in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  
  this = (Aircraft *)operator_new(0x420);
  XPMP2::LegacyAircraft::LegacyAircraft
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38,in_RDI,
             (void *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_00000008),in_stack_ffffffffffffff60
             ,in_stack_ffffffffffffff68);
  XVar1 = XPMP2::Aircraft::GetModeS_ID(this);
  return XVar1;
}

Assistant:

XPMPPlaneID XPMPCreatePlaneWithModelName(const char *       inModelName,
                                         const char *       inICAOCode,
                                         const char *       inAirline,
                                         const char *       inLivery,
                                         XPMPPlaneData_f    inDataFunc,
                                         void *             inRefcon,
                                         XPMPPlaneID        inModeS_id)
{
    try {
#ifndef __clang_analyzer__
        LegacyAircraft* pAc = new LegacyAircraft(inICAOCode,
                                                 inAirline,
                                                 inLivery,
                                                 inDataFunc,
                                                 inRefcon,
                                                 inModeS_id,
                                                 inModelName);
        // This is not leaking memory, the pointer is in glob.mapAc as taken care of by the constructor
        return pAc->GetModeS_ID();
#endif
    }
    catch (const XPMP2Error& e) {
        // This might be thrown in case of problems creating the object
        LOG_MSG(logERR, "Could not create plane object for %s/%s/%s/0x%06X/%s: %s",
                inICAOCode  ? inICAOCode    : "<null>",
                inAirline   ? inAirline     : "<null>",
                inLivery    ? inLivery      : "<null>",
                inModeS_id,
                inModelName ? inModelName   : "<null>",
                e.what());
        return 0;
    }
}